

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::wsi::anon_unknown_0::DisplayTimingTestInstance::iterate
          (TestStatus *__return_storage_ptr__,DisplayTimingTestInstance *this)

{
  VkExtent2D *pVVar1;
  DeviceDriver *pDVar2;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar3;
  deUint64 *pdVar4;
  VkExtent2D VVar5;
  VkFormat VVar6;
  float fVar7;
  uint uVar8;
  VkSwapchainKHR obj;
  pointer pHVar9;
  pointer pHVar10;
  VkRenderPass obj_00;
  VkPipeline obj_01;
  pointer pHVar11;
  pointer pHVar12;
  pointer pHVar13;
  pointer pHVar14;
  pointer pHVar15;
  pointer pHVar16;
  pointer pHVar17;
  pointer pHVar18;
  pointer ppVVar19;
  pointer ppVVar20;
  VkPipelineShaderStageCreateInfo *pVVar21;
  TestLog *pTVar22;
  qpTestLog *pqVar23;
  _Base_ptr p_Var24;
  deUint64 dVar25;
  size_t sVar26;
  VkDevice_s *pVVar27;
  long lVar28;
  DeviceInterface *pDVar29;
  pointer pcVar30;
  pointer pVVar31;
  TestStatus *pTVar32;
  undefined8 uVar33;
  Handle<(vk::HandleType)18> HVar34;
  VkAllocationCallbacks *pVVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  VkDevice pVVar38;
  VkPipelineShaderStageCreateInfo *pVVar39;
  VkCommandPool VVar40;
  VkImage VVar41;
  bool bVar42;
  VkResult VVar43;
  qpTestResult qVar44;
  pointer pHVar45;
  mapped_type_conflict1 *pmVar46;
  long *plVar47;
  deUint64 dVar48;
  VkDevice *ppVVar49;
  TestLog *pTVar50;
  mapped_type_conflict1 mVar51;
  undefined8 extraout_RDX;
  deUint32 dVar52;
  ulong uVar53;
  pointer pHVar54;
  ulong uVar55;
  VkDevice pVVar56;
  long lVar57;
  VkPipelineRasterizationStateCreateInfo rasterizationState;
  VkPipelineDepthStencilStateCreateInfo depthStencilState;
  VkPipelineShaderStageCreateInfo stages [2];
  deUint32 numPastPresentationTimings;
  VkCommandBufferAllocateInfo allocateInfo;
  VkSampleMask sampleMask;
  VkPipelineMultisampleStateCreateInfo multisampleState;
  VkAttachmentReference colorAttachmentRefs [1];
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkPipelineViewportStateCreateInfo viewportState;
  VkRect2D scissors [1];
  VkPipelineDynamicStateCreateInfo dynamicState;
  VkPipelineColorBlendAttachmentState attachmentBlendState;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  VkSpecializationInfo shaderSpecialization;
  undefined1 local_698 [16];
  pointer local_688;
  VkPipelineShaderStageCreateInfo *pVStack_680;
  undefined8 local_678;
  VkRect2D *pVStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  ulong local_658;
  TestStatus *local_650;
  undefined1 local_648 [16];
  VkDevice local_638;
  VkPipelineShaderStageCreateInfo *pVStack_630;
  undefined8 local_628;
  VkSubpassDescription *pVStack_620;
  undefined8 local_618;
  VkSubpassDependency *pVStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined1 local_5d8 [16];
  VkDevice pVStack_5c8;
  VkCommandPool VStack_5c0;
  PFN_vkInternalAllocationNotification local_5b8;
  PFN_vkInternalFreeNotification local_5b0;
  undefined4 local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  deUint64 local_590;
  char *local_588;
  PFN_vkInternalFreeNotification local_580;
  ulong local_570;
  undefined1 local_568 [8];
  qpTestLog *pqStack_560;
  TestLog local_558;
  _Base_ptr p_Stack_550;
  _Base_ptr p_Stack_548;
  VkExtent2D local_540;
  undefined4 local_538;
  undefined1 *local_530;
  ios_base local_4f0 [296];
  undefined1 local_3c8 [16];
  VkCommandPool local_3b8;
  VkImage VStack_3b0;
  undefined8 local_3a8;
  VkPipelineInputAssemblyStateCreateInfo *pVStack_3a0;
  VkExtent2D local_398;
  VkPipelineViewportStateCreateInfo *pVStack_390;
  VkPipelineRasterizationStateCreateInfo *local_388;
  VkPipelineMultisampleStateCreateInfo *local_380;
  VkPipelineDepthStencilStateCreateInfo *local_378;
  VkPipelineColorBlendStateCreateInfo *local_370;
  VkPipelineDynamicStateCreateInfo *local_368;
  VkPipelineLayout local_360;
  VkRenderPass local_358;
  deUint32 local_350;
  VkPipeline local_348;
  deInt32 local_340;
  Move<vk::Handle<(vk::HandleType)18>_> local_248;
  TestLog *local_220;
  VkSampleMask local_214 [25];
  VkPipelineMultisampleStateCreateInfo local_1b0;
  VkFence local_180;
  void *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  VkPipelineColorBlendAttachmentState *local_160;
  float local_158 [4];
  VkPipelineShaderStageCreateInfo local_148;
  Handle<(vk::HandleType)4> local_118;
  void *local_110;
  undefined8 local_108;
  undefined8 *local_100;
  VkCullModeFlags local_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  float local_e0;
  uint local_dc;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  undefined8 local_c8;
  VkPipelineDynamicStateCreateInfo local_b8;
  VkPipelineColorBlendAttachmentState local_98;
  VkPipelineInputAssemblyStateCreateInfo local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar53 = this->m_frameNdx;
  local_650 = __return_storage_ptr__;
  if (uVar53 == 0) {
    if (this->m_outOfDateCount == 0) {
      local_568 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560,"Swapchain: ",0xb);
      ::vk::operator<<((ostream *)&pqStack_560,&this->m_swapchainConfig);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
      std::ios_base::~ios_base(local_4f0);
    }
    VVar6 = (this->m_swapchainConfig).imageFormat;
    pVVar1 = &(this->m_swapchainConfig).imageExtent;
    fVar7 = (float)pVVar1->width;
    uVar8 = (this->m_swapchainConfig).imageExtent.height;
    VVar5 = *pVVar1;
    pDVar2 = &this->m_vkd;
    ::vk::createSwapchainKHR
              ((Move<vk::Handle<(vk::HandleType)26>_> *)local_648,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               &this->m_swapchainConfig,(VkAllocationCallbacks *)0x0);
    pVVar21 = pVStack_630;
    pVVar56 = local_638;
    uVar37 = local_648._8_8_;
    uVar36 = local_648._0_8_;
    local_3b8.m_internal = (deUint64)local_638;
    VStack_3b0.m_internal = (deUint64)pVStack_630;
    local_3c8._0_8_ = local_648._0_8_;
    local_3c8._8_8_ = local_648._8_8_;
    local_648._0_8_ = (_func_int **)0x0;
    local_648._8_8_ = (DeviceInterface *)0x0;
    local_638 = (VkDevice)0x0;
    pVStack_630 = (VkPipelineShaderStageCreateInfo *)0x0;
    obj.m_internal =
         (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal
    ;
    if (obj.m_internal == 0) {
      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_device =
           pVVar56;
      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)pVVar21;
      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal =
           uVar36;
      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)uVar37;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                (&(this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter,
                 obj);
      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_device =
           (VkDevice)local_3b8.m_internal;
      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)VStack_3b0.m_internal;
      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal =
           local_3c8._0_8_;
      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)local_3c8._8_8_;
      if ((_func_int **)local_648._0_8_ != (_func_int **)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)26>_> *)(local_648 + 8),
                   (VkSwapchainKHR)local_648._0_8_);
      }
    }
    ::vk::wsi::getSwapchainImages
              ((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)local_3c8,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkSwapchainKHR)
               (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
               m_internal);
    pHVar9 = (this->m_swapchainImages).
             super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar10 = (this->m_swapchainImages).
              super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_swapchainImages).
    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->m_swapchainImages).
    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->m_swapchainImages).
    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.m_internal;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    local_3b8.m_internal = 0;
    if ((pHVar9 != (pointer)0x0) &&
       (operator_delete(pHVar9,(long)pHVar10 - (long)pHVar9),
       (pointer)local_3c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_3c8._0_8_,local_3b8.m_internal - local_3c8._0_8_);
    }
    local_5d8._0_8_ = (ulong)VVar6 << 0x20;
    local_5d8._8_8_ = &DAT_00000001;
    pVStack_5c8 = (VkDevice)0x200000000;
    VStack_5c0.m_internal = 0x200000001;
    local_5b8 = (PFN_vkInternalAllocationNotification)CONCAT44(local_5b8._4_4_,0x3b9acdea);
    local_180.m_internal = 0x200000000;
    local_3b8.m_internal = 0;
    pVStack_3a0 = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
    local_388 = (VkPipelineRasterizationStateCreateInfo *)0x0;
    local_398 = (VkExtent2D)0x0;
    pVStack_390 = (VkPipelineViewportStateCreateInfo *)0x0;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    VStack_3b0.m_internal = (deUint64)&DAT_00000001;
    local_648._0_4_ = 0x26;
    local_648._8_8_ = (DeviceInterface *)0x0;
    local_638 = (VkDevice)0x100000000;
    local_628._0_4_ = 1;
    local_618 = (ulong)local_618._4_4_ << 0x20;
    pVStack_610 = (VkSubpassDependency *)0x0;
    pVStack_630 = (VkPipelineShaderStageCreateInfo *)local_5d8;
    pVStack_620 = (VkSubpassDescription *)local_3c8;
    local_3a8 = (VkPipelineColorBlendStateCreateInfo *)&local_180;
    ::vk::createRenderPass
              ((Move<vk::Handle<(vk::HandleType)17>_> *)local_698,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkRenderPassCreateInfo *)local_648,(VkAllocationCallbacks *)0x0);
    pVVar21 = pVStack_680;
    pVVar31 = local_688;
    uVar37 = local_698._8_8_;
    uVar36 = local_698._0_8_;
    local_3b8.m_internal = (deUint64)local_688;
    VStack_3b0.m_internal = (deUint64)pVStack_680;
    local_3c8._0_8_ = local_698._0_8_;
    local_3c8._8_8_ = local_698._8_8_;
    local_698._0_8_ = 0;
    local_698._8_8_ = (pointer)0x0;
    local_688 = (pointer)0x0;
    pVStack_680 = (VkPipelineShaderStageCreateInfo *)0x0;
    pMVar3 = &this->m_renderPass;
    obj_00.m_internal =
         (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
         m_internal;
    if (obj_00.m_internal == 0) {
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           (VkDevice)pVVar31;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)pVVar21;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal = uVar36;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)uVar37;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter
                 ,obj_00);
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           (VkDevice)local_3b8.m_internal;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)VStack_3b0.m_internal;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
           local_3c8._0_8_;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)local_3c8._8_8_;
      if (local_698._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(local_698 + 8),
                   (VkRenderPass)local_698._0_8_);
      }
    }
    local_358.m_internal =
         (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
         m_internal;
    local_360.m_internal =
         (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
         m_internal;
    VStack_5c0.m_internal =
         (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
         m_internal;
    local_590 = (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
                .object.m_internal;
    local_5b0 = (PFN_vkInternalFreeNotification)&local_58;
    local_5d8._0_4_ = 0x12;
    local_5d8._8_8_ = (DeviceInterface *)0x0;
    pVStack_5c8 = (VkDevice)0x100000000;
    local_5b8 = (PFN_vkInternalAllocationNotification)0xac0965;
    local_5a8 = 0x12;
    local_5a0 = 0;
    local_598 = 0x1000000000;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_588 = "main";
    local_100 = &local_d8;
    local_d8 = 0;
    local_d0 = (float)(uint)fVar7;
    local_cc = (float)uVar8;
    local_c8 = 0x3f80000000000000;
    local_f0 = &local_e8;
    local_e8._0_4_ = 0.0;
    local_e8._4_4_ = 0.0;
    pVStack_390 = (VkPipelineViewportStateCreateInfo *)&local_118;
    local_118.m_internal._0_4_ = 0x16;
    local_110 = (void *)0x0;
    local_108._0_4_ = 0;
    local_108._4_4_ = 1;
    local_f8 = 1;
    local_698._8_8_ = (pointer)0x0;
    pVStack_680 = (VkPipelineShaderStageCreateInfo *)0x0;
    pVStack_670 = (VkRect2D *)0x0;
    local_668._0_4_ = 0.0;
    local_668._4_4_ = 0.0;
    local_698._0_8_ = &DAT_00000026;
    local_688 = (pointer)0x100000000;
    local_678._0_4_ = 0;
    local_678._4_4_ = VK_FRONT_FACE_CLOCKWISE;
    local_1b0.pSampleMask = local_214;
    local_214[0] = 0xffffffff;
    local_380 = &local_1b0;
    local_1b0.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
    local_1b0.pNext = (void *)0x0;
    local_1b0.flags = 0;
    local_1b0.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
    local_1b0.sampleShadingEnable = 0;
    local_1b0.minSampleShading = 0.0;
    local_648._8_8_ = (DeviceInterface *)0x0;
    local_638 = (VkDevice)0x0;
    pVStack_610 = (VkSubpassDependency *)0x0;
    uStack_5f0 = 0;
    local_608 = 0;
    uStack_600 = 0;
    local_628._0_4_ = 0;
    local_628._4_4_ = 0;
    pVStack_620 = (VkSubpassDescription *)0x0;
    local_648._0_8_ = (_func_int **)0x19;
    pVStack_630 = (VkPipelineShaderStageCreateInfo *)0x700000000;
    local_618._0_4_ = 0;
    local_618._4_4_ = 7;
    local_5f8 = 7;
    uStack_660._0_4_ = 1.0;
    uStack_660._4_4_ = 0;
    local_5e8 = 0x3f80000000000000;
    local_180.m_internal._0_4_ = 0x1a;
    local_178 = (void *)0x0;
    uStack_170 = 0;
    local_168 = 0x100000003;
    local_160 = &local_98;
    local_98.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
    local_98.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
    local_98.alphaBlendOp = VK_BLEND_OP_ADD;
    local_98.colorWriteMask = 0xf;
    local_98.blendEnable = 0;
    local_98.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
    local_98.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
    local_98.colorBlendOp = VK_BLEND_OP_ADD;
    local_3c8._0_4_ = 0x1c;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    local_3b8.m_internal = 0x200000000;
    local_3a8 = (VkPipelineColorBlendStateCreateInfo *)&local_148;
    local_148.pNext = (void *)0x0;
    local_148.pName = (char *)0x0;
    local_148.pSpecializationInfo = (VkSpecializationInfo *)0x0;
    local_148.flags = 0;
    local_148.stage = 0;
    local_148.module.m_internal = 0;
    local_148.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    local_148._4_4_ = 0;
    pVStack_3a0 = &local_78;
    local_78.flags = 0;
    local_78.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    local_78.primitiveRestartEnable = 0;
    local_78._28_4_ = 0;
    local_78.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
    local_78._4_4_ = 0;
    local_78.pNext = (void *)0x0;
    local_398.width = 0;
    local_398.height = 0;
    local_1b0.alphaToCoverageEnable = 0;
    local_1b0.alphaToOneEnable = 0;
    local_388 = (VkPipelineRasterizationStateCreateInfo *)local_698;
    local_368 = &local_b8;
    local_b8.flags = 0;
    local_b8.dynamicStateCount = 0;
    local_b8.pDynamicStates = (VkDynamicState *)0x0;
    local_b8.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
    local_b8._4_4_ = 0;
    local_b8.pNext = (void *)0x0;
    local_350 = 0;
    local_348.m_internal = 0;
    local_340 = 0;
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    local_158[3] = 0.0;
    local_580 = local_5b0;
    VStack_3b0.m_internal = (deUint64)local_5d8;
    local_378 = (VkPipelineDepthStencilStateCreateInfo *)local_648;
    local_370 = (VkPipelineColorBlendStateCreateInfo *)&local_180;
    local_e0 = fVar7;
    local_dc = uVar8;
    ::vk::createGraphicsPipeline
              (&local_248,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkPipelineCache)0x0,
               (VkGraphicsPipelineCreateInfo *)local_3c8,(VkAllocationCallbacks *)0x0);
    pVVar35 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    pVVar56 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    pDVar29 = local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    HVar34.m_internal =
         local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    local_3b8.m_internal =
         (deUint64)local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    VStack_3b0.m_internal =
         (deUint64)
         local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    local_3c8._0_8_ =
         local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    local_3c8._8_8_ =
         local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
    local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    obj_01.m_internal =
         (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    if (obj_01.m_internal == 0) {
      (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           pVVar56;
      (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           pVVar35;
      (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           HVar34.m_internal;
      (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
           = pDVar29;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 obj_01);
      (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)local_3b8.m_internal;
      (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)VStack_3b0.m_internal;
      (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           local_3c8._0_8_;
      (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)local_3c8._8_8_;
      if (local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                   (VkPipeline)
                   local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
                  );
      }
    }
    local_648._0_8_ = (_func_int **)0x0;
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            *)local_3c8,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_648,
           (allocator_type *)local_5d8);
    pHVar11 = (this->m_swapchainImageViews).
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar12 = (this->m_swapchainImageViews).
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_swapchainImageViews).
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->m_swapchainImageViews).
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->m_swapchainImageViews).
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.m_internal;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    local_3b8.m_internal = 0;
    if ((pHVar11 != (pointer)0x0) &&
       (operator_delete(pHVar11,(long)pHVar12 - (long)pHVar11),
       (pointer)local_3c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_3c8._0_8_,local_3b8.m_internal - local_3c8._0_8_);
    }
    local_648._0_8_ = (_func_int **)0x0;
    std::vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
            *)local_3c8,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_648,
           (allocator_type *)local_5d8);
    pHVar13 = (this->m_framebuffers).
              super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar14 = (this->m_framebuffers).
              super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_framebuffers).
    super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->m_framebuffers).
    super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->m_framebuffers).
    super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.m_internal;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    local_3b8.m_internal = 0;
    if ((pHVar13 != (pointer)0x0) &&
       (operator_delete(pHVar13,(long)pHVar14 - (long)pHVar13),
       (pointer)local_3c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_3c8._0_8_,local_3b8.m_internal - local_3c8._0_8_);
    }
    local_648._0_8_ = (_func_int **)0x0;
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *
           )local_3c8,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_648,
           (allocator_type *)local_5d8);
    pHVar15 = (this->m_acquireSemaphores).
              super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar16 = (this->m_acquireSemaphores).
              super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_acquireSemaphores).
    super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->m_acquireSemaphores).
    super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->m_acquireSemaphores).
    super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.m_internal;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    local_3b8.m_internal = 0;
    if ((pHVar15 != (pointer)0x0) &&
       (operator_delete(pHVar15,(long)pHVar16 - (long)pHVar15),
       (pointer)local_3c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_3c8._0_8_,local_3b8.m_internal - local_3c8._0_8_);
    }
    local_648._0_8_ = (_func_int **)0x0;
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *
           )local_3c8,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_648,
           (allocator_type *)local_5d8);
    pHVar15 = (this->m_renderSemaphores).
              super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar16 = (this->m_renderSemaphores).
              super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_renderSemaphores).
    super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->m_renderSemaphores).
    super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->m_renderSemaphores).
    super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.m_internal;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    local_3b8.m_internal = 0;
    if ((pHVar15 != (pointer)0x0) &&
       (operator_delete(pHVar15,(long)pHVar16 - (long)pHVar15),
       (pointer)local_3c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_3c8._0_8_,local_3b8.m_internal - local_3c8._0_8_);
    }
    pHVar45 = (pointer)operator_new(0x30);
    pHVar45[4].m_internal = 0;
    pHVar45[5].m_internal = 0;
    pHVar45[2].m_internal = 0;
    pHVar45[3].m_internal = 0;
    pHVar45->m_internal = 0;
    pHVar45[1].m_internal = 0;
    pHVar54 = pHVar45 + 6;
    pHVar17 = (this->m_fences).
              super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar18 = (this->m_fences).
              super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_fences).
    super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pHVar45;
    (this->m_fences).
    super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pHVar54;
    (this->m_fences).
    super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pHVar54;
    if (pHVar17 != (pointer)0x0) {
      operator_delete(pHVar17,(long)pHVar18 - (long)pHVar17);
      pHVar45 = (this->m_fences).
                super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar54 = (this->m_fences).
                super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_648._0_8_ = (pointer)0x0;
    std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
              ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
               local_3c8,(long)pHVar54 - (long)pHVar45 >> 3,(value_type *)local_648,
               (allocator_type *)local_5d8);
    ppVVar19 = (this->m_commandBuffers).
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVVar20 = (this->m_commandBuffers).
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_commandBuffers).
    super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->m_commandBuffers).
    super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->m_commandBuffers).
    super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.m_internal;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    local_3b8.m_internal = 0;
    if ((ppVVar19 != (pointer)0x0) &&
       (operator_delete(ppVVar19,(long)ppVVar20 - (long)ppVVar19),
       (pointer)local_3c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_3c8._0_8_,local_3b8.m_internal - local_3c8._0_8_);
    }
    (this->m_freeAcquireSemaphore).m_internal = 0;
    (this->m_freeRenderSemaphore).m_internal = 0;
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)local_3c8,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
               (VkAllocationCallbacks *)0x0);
    (this->m_freeAcquireSemaphore).m_internal = local_3c8._0_8_;
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)local_3c8,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
               (VkAllocationCallbacks *)0x0);
    (this->m_freeRenderSemaphore).m_internal = local_3c8._0_8_;
    pVVar56 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
    if ((this->m_swapchainImageViews).
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_swapchainImageViews).
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar53 = 0;
      uVar36 = local_648._0_8_;
      uVar37 = local_648._8_8_;
      pVVar38 = local_638;
      pVVar21 = pVStack_630;
      do {
        pVStack_630 = pVVar21;
        local_638 = pVVar38;
        local_648._8_8_ = uVar37;
        local_648._0_8_ = uVar36;
        VStack_3b0.m_internal =
             (this->m_swapchainImages).
             super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar53].m_internal;
        local_3c8._0_4_ = 0xf;
        local_3c8._8_8_ = (DeviceInterface *)0x0;
        local_3b8.m_internal = local_3b8.m_internal & 0xffffffff00000000;
        local_3a8 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(VVar6,1);
        pVStack_3a0 = (VkPipelineInputAssemblyStateCreateInfo *)0x400000003;
        local_398.width = 5;
        local_398.height = 6;
        pVStack_390 = (VkPipelineViewportStateCreateInfo *)&DAT_00000001;
        local_388 = (VkPipelineRasterizationStateCreateInfo *)&DAT_00000001;
        local_380 = (VkPipelineMultisampleStateCreateInfo *)CONCAT44(local_380._4_4_,1);
        ::vk::createImageView
                  ((Move<vk::Handle<(vk::HandleType)13>_> *)local_648,&pDVar2->super_DeviceInterface
                   ,pVVar56,(VkImageViewCreateInfo *)local_3c8,(VkAllocationCallbacks *)0x0);
        uVar33 = local_648._0_8_;
        local_648._0_8_ = (pointer)0x0;
        uVar36 = local_648._0_8_;
        local_648._8_8_ = (DeviceInterface *)0x0;
        uVar37 = local_648._8_8_;
        local_638 = (VkDevice)0x0;
        pVVar38 = local_638;
        pVStack_630 = (VkPipelineShaderStageCreateInfo *)0x0;
        pVVar21 = pVStack_630;
        pHVar11 = (this->m_swapchainImageViews).
                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pHVar11[uVar53].m_internal = uVar33;
        pVStack_630 = (VkPipelineShaderStageCreateInfo *)0x0;
        local_638 = (VkDevice)0x0;
        local_648._8_8_ = (DeviceInterface *)0x0;
        local_648._0_8_ = (pointer)0x0;
        uVar53 = uVar53 + 1;
      } while (uVar53 < (ulong)((long)(this->m_swapchainImageViews).
                                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar11 >>
                               3));
      pVVar56 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
    }
    pVVar21 = (VkPipelineShaderStageCreateInfo *)
              (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            *)local_5d8,&this->m_swapchainImageViews);
    if ((this->m_framebuffers).
        super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_framebuffers).
        super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar53 = 0;
      uVar36 = local_648._0_8_;
      uVar37 = local_648._8_8_;
      pVVar38 = local_638;
      pVVar39 = pVStack_630;
      do {
        pVStack_630 = pVVar39;
        local_638 = pVVar38;
        local_648._8_8_ = uVar37;
        local_648._0_8_ = uVar36;
        local_698._0_8_ = *(undefined8 *)(local_5d8._0_8_ + uVar53 * 8);
        local_3c8._0_4_ = 0x25;
        local_3c8._8_8_ = (DeviceInterface *)0x0;
        local_3b8.m_internal = local_3b8.m_internal & 0xffffffff00000000;
        local_3a8 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(local_3a8._4_4_,1);
        pVStack_3a0 = (VkPipelineInputAssemblyStateCreateInfo *)local_698;
        pVStack_390 = (VkPipelineViewportStateCreateInfo *)CONCAT44(pVStack_390._4_4_,1);
        VStack_3b0.m_internal = (deUint64)pVVar21;
        local_398 = VVar5;
        ::vk::createFramebuffer
                  ((Move<vk::Handle<(vk::HandleType)23>_> *)local_648,&pDVar2->super_DeviceInterface
                   ,pVVar56,(VkFramebufferCreateInfo *)local_3c8,(VkAllocationCallbacks *)0x0);
        uVar33 = local_648._0_8_;
        local_648._0_8_ = (pointer)0x0;
        uVar36 = local_648._0_8_;
        local_648._8_8_ = (DeviceInterface *)0x0;
        uVar37 = local_648._8_8_;
        local_638 = (VkDevice)0x0;
        pVVar38 = local_638;
        pVStack_630 = (VkPipelineShaderStageCreateInfo *)0x0;
        pVVar39 = pVStack_630;
        pHVar13 = (this->m_framebuffers).
                  super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pHVar13[uVar53].m_internal = uVar33;
        pVStack_630 = (VkPipelineShaderStageCreateInfo *)0x0;
        local_638 = (VkDevice)0x0;
        local_648._8_8_ = (DeviceInterface *)0x0;
        local_648._0_8_ = (pointer)0x0;
        uVar53 = uVar53 + 1;
      } while (uVar53 < (ulong)((long)(this->m_framebuffers).
                                      super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar13 >>
                               3));
    }
    if ((VkCommandBuffer_s *)local_5d8._0_8_ != (VkCommandBuffer_s *)0x0) {
      operator_delete((void *)local_5d8._0_8_,(long)pVStack_5c8 - local_5d8._0_8_);
    }
    initSemaphores(&pDVar2->super_DeviceInterface,
                   (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   &this->m_acquireSemaphores);
    initSemaphores(&pDVar2->super_DeviceInterface,
                   (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   &this->m_renderSemaphores);
    if ((this->m_fences).
        super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_fences).
        super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pVVar56 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
      uVar53 = 0;
      uVar36 = local_3c8._0_8_;
      uVar37 = local_3c8._8_8_;
      VVar40.m_internal = local_3b8.m_internal;
      VVar41.m_internal = VStack_3b0.m_internal;
      do {
        VStack_3b0.m_internal = VVar41.m_internal;
        local_3b8.m_internal = VVar40.m_internal;
        local_3c8._8_8_ = uVar37;
        local_3c8._0_8_ = uVar36;
        ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_3c8,
                          &pDVar2->super_DeviceInterface,pVVar56,0,(VkAllocationCallbacks *)0x0);
        uVar33 = local_3c8._0_8_;
        local_3b8.m_internal = 0;
        VVar40.m_internal = local_3b8.m_internal;
        VStack_3b0.m_internal = 0;
        VVar41.m_internal = VStack_3b0.m_internal;
        local_3c8._0_8_ = (pointer)0x0;
        uVar36 = local_3c8._0_8_;
        local_3c8._8_8_ = (DeviceInterface *)0x0;
        uVar37 = local_3c8._8_8_;
        pHVar17 = (this->m_fences).
                  super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pHVar17[uVar53].m_internal = uVar33;
        VStack_3b0.m_internal = 0;
        local_3b8.m_internal = 0;
        local_3c8._8_8_ = (DeviceInterface *)0x0;
        local_3c8._0_8_ = (pointer)0x0;
        uVar53 = uVar53 + 1;
      } while (uVar53 < (ulong)((long)(this->m_fences).
                                      super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar17 >>
                               3));
    }
    if (this->m_useDisplayTiming == true) {
      local_568 = (undefined1  [8])0x0;
      pqStack_560 = (qpTestLog *)0x0;
      local_558.m_log = (qpTestLog *)0x0;
      local_540.width = 0;
      local_540.height = 0;
      p_Stack_550 = (_Base_ptr)&pqStack_560;
      p_Stack_548 = (_Base_ptr)&pqStack_560;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::clear(&(this->m_queuePresentTimes)._M_t);
      if (local_558.m_log != (qpTestLog *)0x0) {
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)pqStack_560;
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_558.m_log;
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             p_Stack_550;
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             p_Stack_548;
        (local_558.m_log)->lock =
             (deMutex)&(this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header;
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)local_540;
        local_558.m_log = (qpTestLog *)0x0;
        local_540.width = 0;
        local_540.height = 0;
        p_Stack_550 = (_Base_ptr)&pqStack_560;
        p_Stack_548 = (_Base_ptr)&pqStack_560;
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                   *)local_568);
      ::vk::DeviceDriver::getRefreshCycleDurationGOOGLE
                (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkSwapchainKHR)
                 (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
                 m_internal,&this->m_rcDuration);
      this->m_refreshDurationMultiplier = 1;
      this->m_targetIPD = (this->m_rcDuration).refreshDuration;
      this->m_prevDesiredPresentTime = 0;
      this->m_nextPresentID = 0;
      this->m_ignoreThruPresentID = 0;
    }
    uVar53 = this->m_frameNdx;
  }
  pHVar17 = (this->m_fences).
            super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar55 = (long)(this->m_fences).
                 super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar17 >> 3;
  local_180.m_internal = pHVar17[uVar53 % uVar55].m_internal;
  VVar5 = (this->m_swapchainConfig).imageExtent;
  pTVar22 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  if (uVar55 <= uVar53) {
    pDVar2 = &this->m_vkd;
    VVar43 = ::vk::DeviceDriver::waitForFences
                       (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                        &local_180,1,0xffffffffffffffff);
    ::vk::checkResult(VVar43,"m_vkd.waitForFences(*m_device, 1u, &fence, VK_TRUE, foreverNs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x43d);
    VVar43 = ::vk::DeviceDriver::resetFences
                       (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                        &local_180);
    ::vk::checkResult(VVar43,"m_vkd.resetFences(*m_device, 1u, &fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x43e);
    ppVVar19 = (this->m_commandBuffers).
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ::vk::DeviceDriver::freeCommandBuffers
              (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkCommandPool)
               (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
               m_internal,1,
               ppVVar19 +
               this->m_frameNdx %
               (ulong)((long)(this->m_commandBuffers).
                             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar19 >> 3));
    ppVVar19 = (this->m_commandBuffers).
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVVar19[this->m_frameNdx %
             (ulong)((long)(this->m_commandBuffers).
                           super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar19 >> 3)] =
         (VkCommandBuffer_s *)0x0;
  }
  local_148._0_8_ = (this->m_freeAcquireSemaphore).m_internal;
  local_118.m_internal = (this->m_freeRenderSemaphore).m_internal;
  pDVar2 = &this->m_vkd;
  VVar43 = ::vk::DeviceDriver::acquireNextImageKHR
                     (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                      (VkSwapchainKHR)
                      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.
                      object.m_internal,0xffffffffffffffff,(VkSemaphore)local_148._0_8_,local_180,
                      &local_1b0.sType);
  ::vk::checkResult(VVar43,
                    "m_vkd.acquireNextImageKHR(*m_device, *m_swapchain, foreverNs, currentAcquireSemaphore, fence, &imageIndex)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x449);
  local_3b8.m_internal =
       (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
  ;
  dVar48 = (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
           m_internal;
  pqVar23 = (qpTestLog *)
            (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
            m_internal;
  p_Var24 = (_Base_ptr)
            (this->m_framebuffers).
            super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1b0.sType].m_internal;
  dVar25 = (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
           m_internal;
  sVar26 = this->m_frameNdx;
  dVar52 = this->m_quadCount;
  local_3c8._0_4_ = 0x28;
  local_3c8._8_8_ = (DeviceInterface *)0x0;
  VStack_3b0.m_internal = 0x100000000;
  local_638 = (VkDevice)0x0;
  pVStack_630 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_648._0_8_ = (VkDevice *)0x2a;
  local_648._8_8_ = (DeviceInterface *)0x0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_5d8,&pDVar2->super_DeviceInterface,
             (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkCommandBufferAllocateInfo *)local_3c8);
  VVar43 = (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x49])
                     (pDVar2,local_5d8._0_8_,local_648);
  ::vk::checkResult(VVar43,"vkd.beginCommandBuffer(*commandBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x12f);
  local_698._0_8_ = 0x3f0000003e800000;
  local_698._8_8_ = (pointer)0x3f8000003f400000;
  local_568._0_4_ = 0x2b;
  pqStack_560 = (qpTestLog *)0x0;
  p_Stack_548 = (_Base_ptr)0x0;
  local_538 = 1;
  local_558.m_log = pqVar23;
  p_Stack_550 = p_Var24;
  local_540 = VVar5;
  local_530 = local_698;
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x74])(pDVar2,local_5d8._0_8_,local_568,0)
  ;
  uVar36 = local_5d8._0_8_;
  local_698._0_4_ = (int)sVar26;
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x73])
            (pDVar2,local_5d8._0_8_,dVar48,0x10,0,4,local_698);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x4c])(pDVar2,uVar36,0,dVar25);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x59])
            (pDVar2,uVar36,(ulong)(dVar52 * 6),1,0,0);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x76])(pDVar2,local_5d8._0_8_);
  VVar43 = (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x4a])(pDVar2,local_5d8._0_8_);
  ::vk::checkResult(VVar43,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x149);
  ppVVar19 = (this->m_commandBuffers).
             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppVVar19[this->m_frameNdx %
           (ulong)((long)(this->m_commandBuffers).
                         super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar19 >> 3)] =
       (VkCommandBuffer_s *)local_5d8._0_8_;
  VStack_5c0.m_internal = 0;
  pVStack_5c8 = (VkDevice)0x0;
  local_5d8._8_8_ = (DeviceInterface *)0x0;
  local_5d8._0_8_ = (VkCommandBuffer_s *)0x0;
  if (this->m_useDisplayTiming != true) goto LAB_00723fb5;
  pVVar27 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  dVar48 = (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
           m_internal;
  local_698._0_8_ = (void *)0x0;
  local_698._8_8_ = (pointer)0x0;
  local_688 = (pointer)0x0;
  local_568 = (undefined1  [8])((ulong)local_568 & 0xffffffff00000000);
  (*(this->m_vkd).super_DeviceInterface._vptr_DeviceInterface[0x95])
            (pDVar2,pVVar27,dVar48,local_568,0);
  std::
  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>::
  resize((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
          *)local_698,(ulong)local_568 & 0xffffffff);
  if (local_568._0_4_ != 0) {
    (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x95])
              (pDVar2,pVVar27,dVar48,local_568,local_698._0_8_);
  }
  if (local_698._8_8_ != local_698._0_8_) {
    uVar55 = 0;
    uVar53 = 0;
    bVar42 = false;
LAB_007233f5:
    lVar57 = uVar55 * 0x28;
    local_658 = uVar53;
    do {
      pmVar46 = std::
                map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                ::operator[](&this->m_queuePresentTimes,(key_type *)(local_698._0_8_ + lVar57));
      if (*(ulong *)(local_698._0_8_ + 0x10 + lVar57) < *pmVar46) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_3c8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
        std::ios_base::~ios_base((ios_base *)&local_358);
        plVar47 = (long *)std::__cxx11::string::replace((ulong)local_5d8,0,(char *)0x0,0xb0ecbb);
        local_648._0_8_ = &local_638;
        ppVVar49 = (VkDevice *)(plVar47 + 2);
        if ((VkDevice *)*plVar47 == ppVVar49) {
          local_638 = *ppVVar49;
          pVStack_630 = (VkPipelineShaderStageCreateInfo *)plVar47[3];
        }
        else {
          local_638 = *ppVVar49;
          local_648._0_8_ = (VkDevice *)*plVar47;
        }
        local_648._8_8_ = plVar47[1];
        *plVar47 = (long)ppVVar49;
        plVar47[1] = 0;
        *(undefined1 *)(plVar47 + 2) = 0;
        plVar47 = (long *)std::__cxx11::string::append(local_648);
        local_568 = (undefined1  [8])&local_558;
        pTVar50 = (TestLog *)(plVar47 + 2);
        if ((TestLog *)*plVar47 == pTVar50) {
          local_558.m_log = pTVar50->m_log;
          p_Stack_550 = (_Base_ptr)plVar47[3];
        }
        else {
          local_558.m_log = pTVar50->m_log;
          local_568 = (undefined1  [8])*plVar47;
        }
        pqStack_560 = (qpTestLog *)plVar47[1];
        *plVar47 = (long)pTVar50;
        plVar47[1] = 0;
        *(undefined1 *)(plVar47 + 2) = 0;
        tcu::ResultCollector::fail(&this->m_resultCollector,(string *)local_568);
        if (local_568 != (undefined1  [8])&local_558) {
          operator_delete((void *)local_568,(ulong)((long)&(local_558.m_log)->flags + 1));
        }
        if ((VkDevice *)local_648._0_8_ != &local_638) {
          operator_delete((void *)local_648._0_8_,(ulong)(local_638 + 1));
        }
        if ((VkCommandBuffer_s *)local_5d8._0_8_ != (VkCommandBuffer_s *)&pVStack_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(pVStack_5c8 + 1));
        }
      }
      if (this->m_ignoreThruPresentID == 0) {
        this->m_prevDesiredPresentTime =
             (ulong)(this->m_nextPresentID - ((pointer)(local_698._8_8_ + -0x28))->presentID) *
             this->m_targetIPD + ((pointer)(local_698._8_8_ + -0x28))->actualPresentTime;
        this->m_ignoreThruPresentID = *(int *)(local_698._0_8_ + lVar57) + 1;
      }
      else if (this->m_ignoreThruPresentID < *(uint *)(local_698._0_8_ + lVar57)) {
        lVar28 = *(long *)(local_698._0_8_ + 8 + lVar57);
        uVar53 = *(ulong *)(local_698._0_8_ + 0x10 + lVar57);
        dVar48 = (this->m_rcDuration).refreshDuration;
        if (dVar48 + lVar28 + 1000000 < uVar53) goto LAB_0072392d;
        if ((*(ulong *)(local_698._0_8_ + 0x18 + lVar57) < uVar53) &&
           ("ERKNS1_19TexComparePrecisionERKNS1_12LodPrecisionERKNS1_6VectorIfLi3EEE" <
            *(char **)(local_698._0_8_ + 0x20 + lVar57))) {
          local_568 = (undefined1  [8])pTVar22;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_560,"Image PresentID ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_560," can be presented ",0x12);
          std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_560," nsec earlier.",0xe);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
          std::ios_base::~ios_base(local_4f0);
          local_568 = (undefined1  [8])pTVar22;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_560,"\t\t   actualPresentTime = ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
          std::ios_base::~ios_base(local_4f0);
          local_568 = (undefined1  [8])pTVar22;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_560,"\t\t -earliestPresentTime= ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
          std::ios_base::~ios_base(local_4f0);
          local_568 = (undefined1  [8])pTVar22;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_560,"\t\t =========================================",0x2c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
          std::ios_base::~ios_base(local_4f0);
          local_568 = (undefined1  [8])pTVar22;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_560,"\t\t   diff              =        ",0x20);
          std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
          std::ios_base::~ios_base(local_4f0);
          bVar42 = true;
        }
      }
      uVar55 = uVar55 + 1;
      lVar57 = lVar57 + 0x28;
      if ((ulong)(((long)(local_698._8_8_ - local_698._0_8_) >> 3) * -0x3333333333333333) <= uVar55)
      {
        if ((local_658 & 1) != 0) goto LAB_00723e93;
        if (!bVar42) break;
        pdVar4 = &this->m_refreshDurationMultiplier;
        *pdVar4 = *pdVar4 - 1;
        if (*pdVar4 != 0) {
          local_568 = (undefined1  [8])pTVar22;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_560,"Decreasing multiplier.",0x16);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00723f62;
        }
        this->m_refreshDurationMultiplier = 1;
        break;
      }
    } while( true );
  }
  goto LAB_00723f7e;
LAB_0072392d:
  local_658 = dVar48;
  local_568 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pqStack_560,"Image PresentID ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," was ",5);
  local_570 = uVar53 - (local_658 + lVar28);
  std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec late.",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
  std::ios_base::~ios_base(local_4f0);
  if ((this->m_ExpectImage80Late == true) && (*(int *)(local_698._0_8_ + lVar57) == 0x50)) {
    if (local_570 < 0x1dcd6501) {
      local_568 = (undefined1  [8])&local_558;
      local_3c8._0_8_ = (qpTestLog *)0x47;
      local_568 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_568,(ulong)local_3c8);
      uVar36 = local_3c8._0_8_;
      local_558.m_log = (qpTestLog *)local_3c8._0_8_;
      local_220 = (TestLog *)local_568;
      memcpy((void *)local_568,
             "Image PresentID 80 was not late by approximately 1 second, as expected.",0x47);
      pqStack_560 = (qpTestLog *)uVar36;
      *(undefined1 *)((long)&local_220->m_log + uVar36) = 0;
      tcu::ResultCollector::fail(&this->m_resultCollector,(string *)local_568);
      if (local_568 != (undefined1  [8])&local_558) {
        operator_delete((void *)local_568,(ulong)((long)&(local_558.m_log)->flags + 1));
      }
    }
    else {
      local_568 = (undefined1  [8])pTVar22;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pqStack_560,
                 "\tNote: Image PresentID 80 was expected to be late by approximately 1 second.",
                 0x4c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
      std::ios_base::~ios_base(local_4f0);
    }
  }
  local_568 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pqStack_560,"\t\t   actualPresentTime = ",0x19);
  std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec",5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
  std::ios_base::~ios_base(local_4f0);
  local_568 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pqStack_560,"\t\t - desiredPresentTime= ",0x19);
  std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec",5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
  std::ios_base::~ios_base(local_4f0);
  local_568 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pqStack_560,"\t\t =========================================",0x2c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
  std::ios_base::~ios_base(local_4f0);
  local_568 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pqStack_560,"\t\t   diff              =       ",0x1f);
  std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec",5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
  std::ios_base::~ios_base(local_4f0);
  local_568 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pqStack_560,"\t\t - refreshDuration   =       ",0x1f);
  std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec",5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
  std::ios_base::~ios_base(local_4f0);
  local_568 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pqStack_560,"\t\t =========================================",0x2c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
  std::ios_base::~ios_base(local_4f0);
  local_568 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pqStack_560,"\t\t   diff              =        ",0x20);
  std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_560);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_560," nsec",5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
  std::ios_base::~ios_base(local_4f0);
  uVar55 = uVar55 + 1;
  uVar53 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  if ((ulong)(((long)(local_698._8_8_ - local_698._0_8_) >> 3) * -0x3333333333333333) <= uVar55)
  goto LAB_00723e93;
  goto LAB_007233f5;
LAB_00723e93:
  uVar53 = this->m_refreshDurationMultiplier + 1;
  this->m_refreshDurationMultiplier = uVar53;
  if (uVar53 < 3) {
    local_568 = (undefined1  [8])pTVar22;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_560);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_560,"Increasing multiplier.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00723f62:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_560);
    std::ios_base::~ios_base(local_4f0);
  }
  else {
    this->m_refreshDurationMultiplier = 2;
  }
LAB_00723f7e:
  this->m_targetIPD = this->m_refreshDurationMultiplier * (this->m_rcDuration).refreshDuration;
  if ((void *)local_698._0_8_ != (void *)0x0) {
    operator_delete((void *)local_698._0_8_,(long)local_688 - local_698._0_8_);
  }
LAB_00723fb5:
  local_648._0_4_ = 0x400;
  local_3c8._0_4_ = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  local_3c8._8_8_ = (DeviceInterface *)0x0;
  local_3b8.m_internal._0_4_ = 1;
  VStack_3b0.m_internal = (deUint64)&local_148;
  local_3a8 = (VkPipelineColorBlendStateCreateInfo *)local_648;
  pVStack_3a0 = (VkPipelineInputAssemblyStateCreateInfo *)CONCAT44(pVStack_3a0._4_4_,1);
  ppVVar19 = (this->m_commandBuffers).
             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_398 = (VkExtent2D)
              (ppVVar19 +
              this->m_frameNdx %
              (ulong)((long)(this->m_commandBuffers).
                            super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar19 >> 3));
  pVStack_390 = (VkPipelineViewportStateCreateInfo *)CONCAT44(pVStack_390._4_4_,1);
  local_388 = (VkPipelineRasterizationStateCreateInfo *)&local_118;
  VVar43 = ::vk::DeviceDriver::queueSubmit
                     (pDVar2,this->m_queue,1,(VkSubmitInfo *)local_3c8,(VkFence)0x0);
  ::vk::checkResult(VVar43,"m_vkd.queueSubmit(m_queue, 1u, &submitInfo, (vk::VkFence)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x4ba);
  if (this->m_useDisplayTiming == true) {
    dVar52 = this->m_nextPresentID + 1;
    this->m_nextPresentID = dVar52;
    local_5d8._0_4_ = dVar52;
    pDVar29 = (DeviceInterface *)this->m_prevDesiredPresentTime;
    local_5d8._8_8_ = pDVar29;
    dVar48 = deGetMicroseconds();
    pmVar46 = std::
              map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              ::operator[](&this->m_queuePresentTimes,&this->m_nextPresentID);
    mVar51 = dVar48 * 1000;
    *pmVar46 = mVar51;
    if (this->m_prevDesiredPresentTime == 0) {
      if (mVar51 == 0) {
        local_5d8._8_8_ = (DeviceInterface *)0x0;
        dVar48 = 0;
      }
      else {
        local_5d8._8_8_ = (this->m_targetIPD >> 1) + mVar51;
        dVar48 = 0;
      }
    }
    else {
      dVar48 = this->m_prevDesiredPresentTime + this->m_targetIPD;
      if (dVar52 == 0x50) {
        local_5d8._8_8_ = pDVar29 + -125000000;
        this->m_ExpectImage80Late = true;
      }
    }
    pVStack_390 = (VkPipelineViewportStateCreateInfo *)local_698;
    pVStack_630 = (VkPipelineShaderStageCreateInfo *)local_5d8;
    local_398 = (VkExtent2D)&local_1b0;
    this->m_prevDesiredPresentTime = dVar48;
    local_648._0_4_ = VK_STRUCTURE_TYPE_PRESENT_TIMES_INFO_GOOGLE;
    local_648._8_8_ = (DeviceInterface *)0x0;
    local_638 = (VkDevice)CONCAT44(local_638._4_4_,1);
    local_3c8._0_4_ = 0x3b9acde9;
    local_3c8._8_8_ = local_648;
    local_3b8.m_internal._0_4_ = 1;
    local_3a8 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(local_3a8._4_4_,1);
    VStack_3b0.m_internal = (deUint64)&local_118;
    pVStack_3a0 = (VkPipelineInputAssemblyStateCreateInfo *)&this->m_swapchain;
    VVar43 = ::vk::DeviceDriver::queuePresentKHR(pDVar2,this->m_queue,(VkPresentInfoKHR *)local_3c8)
    ;
    ::vk::checkResult(VVar43,"m_vkd.queuePresentKHR(m_queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x4fd);
    ::vk::checkResult(local_698._0_4_,"result",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x4fe);
  }
  else {
    local_3c8._0_4_ = 0x3b9acde9;
    local_3c8._8_8_ = (DeviceInterface *)0x0;
    local_3b8.m_internal._0_4_ = 1;
    local_3a8 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(local_3a8._4_4_,1);
    local_398 = (VkExtent2D)&local_1b0;
    pVStack_390 = (VkPipelineViewportStateCreateInfo *)local_648;
    VStack_3b0.m_internal = (deUint64)&local_118;
    pVStack_3a0 = (VkPipelineInputAssemblyStateCreateInfo *)&this->m_swapchain;
    VVar43 = ::vk::DeviceDriver::queuePresentKHR(pDVar2,this->m_queue,(VkPresentInfoKHR *)local_3c8)
    ;
    ::vk::checkResult(VVar43,"m_vkd.queuePresentKHR(m_queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x50f);
    ::vk::checkResult(local_648._0_4_,"result",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x510);
  }
  pTVar32 = local_650;
  uVar53 = (ulong)local_1b0.sType;
  pHVar15 = (this->m_acquireSemaphores).
            super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->m_freeAcquireSemaphore).m_internal = pHVar15[uVar53].m_internal;
  pHVar15[uVar53].m_internal = local_148._0_8_;
  pHVar15 = (this->m_renderSemaphores).
            super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->m_freeRenderSemaphore).m_internal = pHVar15[uVar53].m_internal;
  pHVar15[uVar53].m_internal = local_118.m_internal;
  uVar53 = this->m_frameNdx + 1;
  this->m_frameNdx = uVar53;
  if (uVar53 < this->m_frameCount) {
    tcu::TestStatus::incomplete();
  }
  else {
    deinitSwapchainResources(this);
    qVar44 = tcu::ResultCollector::getResult(&this->m_resultCollector);
    pcVar30 = (this->m_resultCollector).m_message._M_dataplus._M_p;
    local_568 = (undefined1  [8])&local_558;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_568,pcVar30,
               pcVar30 + (this->m_resultCollector).m_message._M_string_length);
    pTVar32->m_code = qVar44;
    (pTVar32->m_description)._M_dataplus._M_p = (pointer)&(pTVar32->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar32->m_description,local_568,
               (long)&pqStack_560->flags + (long)local_568);
    if (local_568 != (undefined1  [8])&local_558) {
      operator_delete((void *)local_568,(ulong)((long)&(local_558.m_log)->flags + 1));
    }
  }
  return pTVar32;
}

Assistant:

tcu::TestStatus DisplayTimingTestInstance::iterate (void)
{
	// Initialize swapchain specific resources
	// Render test
	try
	{
		if (m_frameNdx == 0)
		{
			if (m_outOfDateCount == 0)
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Swapchain: " << m_swapchainConfig << tcu::TestLog::EndMessage;

			initSwapchainResources();
		}

		render();
	}
	catch (const vk::Error& error)
	{
		if (error.getError() == vk::VK_ERROR_OUT_OF_DATE_KHR)
		{
			if (m_outOfDateCount < m_maxOutOfDateCount)
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Frame " << m_frameNdx << ": Swapchain out of date. Recreating resources." << TestLog::EndMessage;
				deinitSwapchainResources();
				m_frameNdx = 0;
				m_outOfDateCount++;

				return tcu::TestStatus::incomplete();
			}
			else
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Frame " << m_frameNdx << ": Swapchain out of date." << TestLog::EndMessage;
				m_resultCollector.fail("Received too many VK_ERROR_OUT_OF_DATE_KHR errors. Received " + de::toString(m_outOfDateCount) + ", max " + de::toString(m_maxOutOfDateCount));
			}
		}
		else
		{
			m_resultCollector.fail(error.what());
		}

		deinitSwapchainResources();

		return tcu::TestStatus(m_resultCollector.getResult(), m_resultCollector.getMessage());
	}

	m_frameNdx++;

	if (m_frameNdx >= m_frameCount)
	{
		deinitSwapchainResources();

		return tcu::TestStatus(m_resultCollector.getResult(), m_resultCollector.getMessage());
	}
	else
		return tcu::TestStatus::incomplete();
}